

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

void __thiscall QDirPrivate::setPath(QDirPrivate *this,QString *path)

{
  qsizetype qVar1;
  QArrayData *pQVar2;
  char *pcVar3;
  qsizetype qVar4;
  QAbstractFileEngine *pQVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  Data *pDVar8;
  bool bVar9;
  __off_t __length;
  long in_FS_OFFSET;
  QString local_88;
  QFileSystemEntry local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.d.d = (path->d).d;
  local_88.d.ptr = (path->d).ptr;
  local_88.d.size = (path->d).size;
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_88.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_88.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar9 = QString::endsWith(&local_88,(QChar)0x2f,CaseSensitive);
  if ((bVar9) && (1 < (ulong)local_88.d.size)) {
    QString::truncate(&local_88,(char *)(local_88.d.size - 1),__length);
  }
  QFileSystemEntry::QFileSystemEntry(&local_68,&local_88);
  pQVar6 = &((this->dirEntry).m_filePath.d.d)->super_QArrayData;
  pcVar7 = (this->dirEntry).m_filePath.d.ptr;
  (this->dirEntry).m_filePath.d.d = local_68.m_filePath.d.d;
  (this->dirEntry).m_filePath.d.ptr = local_68.m_filePath.d.ptr;
  qVar1 = (this->dirEntry).m_filePath.d.size;
  (this->dirEntry).m_filePath.d.size = local_68.m_filePath.d.size;
  pQVar2 = &((this->dirEntry).m_nativeFilePath.d.d)->super_QArrayData;
  pcVar3 = (this->dirEntry).m_nativeFilePath.d.ptr;
  (this->dirEntry).m_nativeFilePath.d.d = local_68.m_nativeFilePath.d.d;
  (this->dirEntry).m_nativeFilePath.d.ptr = local_68.m_nativeFilePath.d.ptr;
  qVar4 = (this->dirEntry).m_nativeFilePath.d.size;
  (this->dirEntry).m_nativeFilePath.d.size = local_68.m_nativeFilePath.d.size;
  (this->dirEntry).m_lastDotInFileName = local_68.m_lastDotInFileName;
  (this->dirEntry).m_lastSeparator = local_68.m_lastSeparator;
  (this->dirEntry).m_firstDotInFileName = local_68.m_firstDotInFileName;
  local_68.m_filePath.d.d = (Data *)pQVar6;
  local_68.m_filePath.d.ptr = pcVar7;
  local_68.m_filePath.d.size = qVar1;
  local_68.m_nativeFilePath.d.d = (Data *)pQVar2;
  local_68.m_nativeFilePath.d.ptr = pcVar3;
  local_68.m_nativeFilePath.d.size = qVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,1,0x10);
    }
  }
  if (&(local_68.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_68.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->fileCache).metaData.knownFlagsMask.
  super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = 0;
  LOCK();
  (this->fileCache).fileListsInitialized._M_base._M_i = false;
  UNLOCK();
  QList<QString>::clear(&(this->fileCache).files);
  QList<QFileInfo>::clear(&(this->fileCache).fileInfos);
  QFileSystemEngine::createLegacyEngine(&local_68,(QFileSystemMetaData *)&this->dirEntry);
  pDVar8 = local_68.m_filePath.d.d;
  local_68.m_filePath.d.d = (Data *)0x0;
  pQVar5 = (this->fileEngine)._M_t.
           super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
           _M_t.
           super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
           super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl;
  (this->fileEngine)._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = (QAbstractFileEngine *)pDVar8;
  if (pQVar5 != (QAbstractFileEngine *)0x0) {
    (*pQVar5->_vptr_QAbstractFileEngine[1])();
  }
  if (local_68.m_filePath.d.d != (Data *)0x0) {
    (**(code **)(*(long *)&(local_68.m_filePath.d.d)->super_QArrayData + 8))();
  }
  QFileSystemEntry::QFileSystemEntry(&local_68);
  pQVar6 = &((this->fileCache).absoluteDirEntry.m_filePath.d.d)->super_QArrayData;
  pcVar7 = (this->fileCache).absoluteDirEntry.m_filePath.d.ptr;
  (this->fileCache).absoluteDirEntry.m_filePath.d.d = local_68.m_filePath.d.d;
  (this->fileCache).absoluteDirEntry.m_filePath.d.ptr = local_68.m_filePath.d.ptr;
  qVar1 = (this->fileCache).absoluteDirEntry.m_filePath.d.size;
  (this->fileCache).absoluteDirEntry.m_filePath.d.size = local_68.m_filePath.d.size;
  pQVar2 = &((this->fileCache).absoluteDirEntry.m_nativeFilePath.d.d)->super_QArrayData;
  pcVar3 = (this->fileCache).absoluteDirEntry.m_nativeFilePath.d.ptr;
  (this->fileCache).absoluteDirEntry.m_nativeFilePath.d.d = local_68.m_nativeFilePath.d.d;
  (this->fileCache).absoluteDirEntry.m_nativeFilePath.d.ptr = local_68.m_nativeFilePath.d.ptr;
  qVar4 = (this->fileCache).absoluteDirEntry.m_nativeFilePath.d.size;
  (this->fileCache).absoluteDirEntry.m_nativeFilePath.d.size = local_68.m_nativeFilePath.d.size;
  (this->fileCache).absoluteDirEntry.m_lastDotInFileName = local_68.m_lastDotInFileName;
  (this->fileCache).absoluteDirEntry.m_lastSeparator = local_68.m_lastSeparator;
  (this->fileCache).absoluteDirEntry.m_firstDotInFileName = local_68.m_firstDotInFileName;
  local_68.m_filePath.d.d = (Data *)pQVar6;
  local_68.m_filePath.d.ptr = pcVar7;
  local_68.m_filePath.d.size = qVar1;
  local_68.m_nativeFilePath.d.d = (Data *)pQVar2;
  local_68.m_nativeFilePath.d.ptr = pcVar3;
  local_68.m_nativeFilePath.d.size = qVar4;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,1,0x10);
    }
  }
  if (&(local_68.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_68.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QDirPrivate::setPath(const QString &path)
{
    QString p = QDir::fromNativeSeparators(path);
    if (p.endsWith(u'/')
            && p.size() > 1
#if defined(Q_OS_WIN)
        && (!(p.length() == 3 && p.at(1).unicode() == ':' && p.at(0).isLetter()))
#endif
    ) {
            p.truncate(p.size() - 1);
    }
    dirEntry = QFileSystemEntry(p, QFileSystemEntry::FromInternalPath());
    clearCache(IncludingMetaData);
    fileCache.absoluteDirEntry = QFileSystemEntry();
}